

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O0

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_list_item *pnVar2;
  char *pcVar3;
  char *__s2;
  nn_ep *pnVar4;
  nn_ep *pnVar5;
  code *in_RSI;
  nn_list *in_RDI;
  nn_ins_item *citem;
  nn_ins_item *bitem;
  nn_list_item *it;
  nn_list_item *in_stack_ffffffffffffff98;
  nn_ep *in_stack_ffffffffffffffa0;
  nn_list_item *in_stack_ffffffffffffffa8;
  nn_list *self;
  nn_list_item *local_40;
  nn_ep *local_20;
  
  nn_mutex_lock((nn_mutex_t *)in_stack_ffffffffffffffa0);
  local_20 = (nn_ep *)nn_list_begin(&::self.bound);
  while( true ) {
    pnVar2 = nn_list_end(&::self.bound);
    if (local_20 == (nn_ep *)pnVar2) {
      self = in_RDI;
      nn_list_end(&::self.bound);
      nn_list_insert(self,in_stack_ffffffffffffffa8,(nn_list_item *)in_stack_ffffffffffffffa0);
      local_20 = (nn_ep *)nn_list_begin(&::self.connected);
      while (pnVar5 = local_20, pnVar4 = (nn_ep *)nn_list_end(&::self.connected), pnVar5 != pnVar4)
      {
        if (local_20 == (nn_ep *)0x0) {
          local_20 = (nn_ep *)0x0;
        }
        in_stack_ffffffffffffffa0 = local_20;
        pnVar5 = (nn_ep *)nn_ep_getaddr((nn_ep *)in_RDI[1].first);
        pcVar3 = nn_ep_getaddr(*(nn_ep **)&(local_20->fsm).state);
        iVar1 = strncmp((char *)pnVar5,pcVar3,0x80);
        if ((iVar1 == 0) && (iVar1 = nn_ep_ispeer_ep(in_stack_ffffffffffffffa0,pnVar5), iVar1 != 0))
        {
          (*in_RSI)(in_RDI,local_20);
        }
        local_20 = (nn_ep *)nn_list_next((nn_list *)in_stack_ffffffffffffffa0,(nn_list_item *)pnVar5
                                        );
      }
      nn_mutex_unlock((nn_mutex_t *)in_stack_ffffffffffffffa0);
      return 0;
    }
    if (local_20 == (nn_ep *)0x0) {
      local_40 = (nn_list_item *)0x0;
    }
    else {
      local_40 = (nn_list_item *)local_20;
    }
    pcVar3 = nn_ep_getaddr((nn_ep *)local_40[1].next);
    __s2 = nn_ep_getaddr((nn_ep *)in_RDI[1].first);
    iVar1 = strncmp(pcVar3,__s2,0x80);
    if (iVar1 == 0) break;
    local_20 = (nn_ep *)nn_list_next((nn_list *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
    ;
  }
  nn_mutex_unlock((nn_mutex_t *)in_stack_ffffffffffffffa0);
  return -0x62;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);

        if (strncmp (nn_ep_getaddr(bitem->ep), nn_ep_getaddr(item->ep),
            NN_SOCKADDR_MAX) == 0) {

            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_ep_getaddr(item->ep), nn_ep_getaddr(citem->ep),
            NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_ep_ispeer_ep (item->ep, citem->ep))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}